

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-error.c
# Opt level: O2

void test_bson_error_basic(void)

{
  char *__format;
  undefined1 auVar1 [16];
  undefined8 uStack_210;
  bson_error_t error;
  
  bson_set_error(&error,0x7b,0x1c8,"%s %u","localhost",0x6989);
  auVar1[0] = -(error.message[0] == 'l');
  auVar1[1] = -(error.message[1] == 'o');
  auVar1[2] = -(error.message[2] == 'c');
  auVar1[3] = -(error.message[3] == 'a');
  auVar1[4] = -(error.message[4] == 'l');
  auVar1[5] = -(error.message[5] == 'h');
  auVar1[6] = -(error.message[6] == 'o');
  auVar1[7] = -(error.message[7] == 's');
  auVar1[8] = -(error.message[8] == 't');
  auVar1[9] = -(error.message[9] == ' ');
  auVar1[10] = -(error.message[10] == '2');
  auVar1[0xb] = -(error.message[0xb] == '7');
  auVar1[0xc] = -(error.message[0xc] == '0');
  auVar1[0xd] = -(error.message[0xd] == '1');
  auVar1[0xe] = -(error.message[0xe] == '7');
  auVar1[0xf] = -(error.message[0xf] == '\0');
  if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf) !=
      0xffff) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-error.c"
            ,0x1c,"test_bson_error_basic","!strcmp (error.message, \"localhost 27017\")");
    abort();
  }
  if (error.domain == 0x7b) {
    if (error.code == 0x1c8) {
      return;
    }
    __format = "FAIL\n\nAssert Failure: (line#%d)error.code == 456\n";
    uStack_210 = 0x1e;
  }
  else {
    __format = "FAIL\n\nAssert Failure: (line#%d)error.domain == 123\n";
    uStack_210 = 0x1d;
  }
  fprintf(_stderr,__format,uStack_210);
  abort();
}

Assistant:

static void
test_bson_error_basic (void)
{
   bson_error_t error;

   bson_set_error (&error, 123, 456, "%s %u", "localhost", 27017);
   BSON_ASSERT (!strcmp (error.message, "localhost 27017"));
   BSON_ASSERT_CMPINT (error.domain, ==, 123);
   BSON_ASSERT_CMPINT (error.code, ==, 456);
}